

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Own<kj::AsyncIoProvider,_std::nullptr_t> __thiscall
kj::newAsyncIoProvider(kj *this,LowLevelAsyncIoProvider *lowLevel)

{
  AsyncIoProvider *extraout_RDX;
  Own<kj::AsyncIoProvider,_std::nullptr_t> OVar1;
  LowLevelAsyncIoProvider *local_18;
  LowLevelAsyncIoProvider *lowLevel_local;
  
  local_18 = lowLevel;
  lowLevel_local = (LowLevelAsyncIoProvider *)this;
  heap<kj::(anonymous_namespace)::AsyncIoProviderImpl,kj::LowLevelAsyncIoProvider&>
            ((kj *)&stack0xffffffffffffffd8,lowLevel);
  Own<kj::AsyncIoProvider,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::AsyncIoProviderImpl,void>
            ((Own<kj::AsyncIoProvider,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::AsyncIoProviderImpl,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  Own<kj::(anonymous_namespace)::AsyncIoProviderImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncIoProviderImpl,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<AsyncIoProvider> newAsyncIoProvider(LowLevelAsyncIoProvider& lowLevel) {
  return kj::heap<AsyncIoProviderImpl>(lowLevel);
}